

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O3

void cmGetCMakeInputs(cmGlobalGenerator *gg,string *sourceDir,string *buildDir,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *internalFiles,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *explicitFiles,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *tmpFiles)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  pointer ppcVar6;
  long lVar7;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  pointer remote;
  bool bVar8;
  string toAdd;
  string cmakeRootDir;
  string startOfFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8;
  ulong local_c0;
  long local_b8 [2];
  string local_a8;
  long *local_88;
  size_t local_80;
  long local_78 [2];
  pointer local_68;
  pointer local_60;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_50;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_48;
  string *local_40;
  pointer local_38;
  
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)explicitFiles;
  local_50 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)tmpFiles;
  local_48 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)internalFiles;
  local_40 = buildDir;
  psVar5 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  local_c8 = local_b8;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + psVar5->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_c8,local_c0,0,'\x01');
  ppcVar6 = (gg->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_68 = (gg->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (ppcVar6 != local_68) {
    paVar1 = &local_e8.field_2;
    do {
      remote = ((*ppcVar6)->ListFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_38 = ((*ppcVar6)->ListFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_60 = ppcVar6;
      if (remote != local_38) {
        do {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)remote);
          if ((local_80 == local_c0) &&
             ((bVar3 = true, local_80 == 0 || (iVar4 = bcmp(local_88,local_c8,local_80), iVar4 == 0)
              ))) {
            bVar8 = false;
          }
          else {
            pcVar2 = (local_40->_M_dataplus)._M_p;
            local_e8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,pcVar2,pcVar2 + local_40->_M_string_length);
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_e8,local_e8._M_string_length,0,'\x01');
            lVar7 = std::__cxx11::string::find((char *)remote,(ulong)local_e8._M_dataplus._M_p,0);
            bVar8 = lVar7 == 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != paVar1) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            bVar3 = false;
          }
          pcVar2 = (remote->_M_dataplus)._M_p;
          local_e8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,pcVar2,pcVar2 + remote->_M_string_length);
          if (sourceDir->_M_string_length != 0) {
            cmSystemTools::RelativePath(&local_a8,sourceDir,remote);
            if (local_a8._M_string_length < local_e8._M_string_length) {
              std::__cxx11::string::_M_assign((string *)&local_e8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
          }
          this = local_48;
          if ((!bVar3) && (this = local_58, bVar8)) {
            this = local_50;
          }
          if (this != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(this,&local_e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != paVar1) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if (local_88 != local_78) {
            operator_delete(local_88,local_78[0] + 1);
          }
          remote = remote + 1;
        } while (remote != local_38);
      }
      ppcVar6 = local_60 + 1;
    } while (ppcVar6 != local_68);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  return;
}

Assistant:

void cmGetCMakeInputs(const cmGlobalGenerator* gg,
                      const std::string& sourceDir,
                      const std::string& buildDir,
                      std::vector<std::string>* internalFiles,
                      std::vector<std::string>* explicitFiles,
                      std::vector<std::string>* tmpFiles)
{
  const std::string cmakeRootDir = cmSystemTools::GetCMakeRoot() + '/';
  std::vector<cmMakefile*> const& makefiles = gg->GetMakefiles();
  for (cmMakefile const* mf : makefiles) {
    for (std::string const& lf : mf->GetListFiles()) {

      const std::string startOfFile = lf.substr(0, cmakeRootDir.size());
      const bool isInternal = (startOfFile == cmakeRootDir);
      const bool isTemporary = !isInternal && (lf.find(buildDir + '/') == 0);

      std::string toAdd = lf;
      if (!sourceDir.empty()) {
        const std::string& relative =
          cmSystemTools::RelativePath(sourceDir, lf);
        if (toAdd.size() > relative.size()) {
          toAdd = relative;
        }
      }

      if (isInternal) {
        if (internalFiles) {
          internalFiles->push_back(std::move(toAdd));
        }
      } else {
        if (isTemporary) {
          if (tmpFiles) {
            tmpFiles->push_back(std::move(toAdd));
          }
        } else {
          if (explicitFiles) {
            explicitFiles->push_back(std::move(toAdd));
          }
        }
      }
    }
  }
}